

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void prescan_quantize(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize)

{
  histcell hVar1;
  int iVar2;
  int iVar3;
  hist3d ppahVar4;
  histcell *phVar5;
  int b;
  int g;
  int r;
  int num_rows;
  int width;
  int col;
  int row;
  hist3d histogram;
  histptr histp;
  int *ptr;
  my_cquantize_ptr cquantize_local;
  gdImagePtr nim_local;
  gdImagePtr oim_local;
  
  ppahVar4 = cquantize->histogram;
  iVar2 = oim->sx;
  iVar3 = oim->sy;
  for (width = 0; width < iVar3; width = width + 1) {
    histp = (histptr)oim->tpixels[width];
    for (num_rows = iVar2; 0 < num_rows; num_rows = num_rows + -1) {
      if ((oim->transparent < 0) || (*(int *)histp != oim->transparent)) {
        phVar5 = ppahVar4[(int)(*(uint *)histp & 0xff0000) >> 0x13]
                 [(int)(*(uint *)histp & 0xff00) >> 10] + ((int)(*(uint *)histp & 0xff) >> 3);
        hVar1 = *phVar5;
        *phVar5 = hVar1 + 1;
        if ((histcell)(hVar1 + 1) == 0) {
          *phVar5 = *phVar5 - 1;
        }
      }
      histp = histp + 2;
    }
  }
  return;
}

Assistant:

METHODDEF (void)
prescan_quantize (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize)
{
	register JSAMPROW ptr;
	register histptr histp;
	register hist3d histogram = cquantize->histogram;
	int row;
	JDIMENSION col;
	int width = oim->sx;
	int num_rows = oim->sy;

	(void)nim;

	for (row = 0; row < num_rows; row++) {
		ptr = input_buf[row];
		for (col = width; col > 0; col--) {
			int r = gdTrueColorGetRed (*ptr) >> C0_SHIFT;
			int g = gdTrueColorGetGreen (*ptr) >> C1_SHIFT;
			int b = gdTrueColorGetBlue (*ptr) >> C2_SHIFT;
			/* 2.0.12: Steven Brown: support a single totally transparent
			   color in the original. */
			if ((oim->transparent >= 0) && (*ptr == oim->transparent)) {
				ptr++;
				continue;
			}
			/* get pixel value and index into the histogram */
			histp = &histogram[r][g][b];
			/* increment, check for overflow and undo increment if so. */
			if (++(*histp) == 0)
				(*histp)--;
			ptr++;
		}
	}
}